

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii85_fuzzer.cc
# Opt level: O2

void __thiscall FuzzHelper::doChecks(FuzzHelper *this)

{
  size_t in_RCX;
  Pl_ASCII85Decoder p;
  Pl_Discard discard;
  Pl_ASCII85Decoder local_90;
  Pipeline local_40;
  
  Pl_Discard::Pl_Discard((Pl_Discard *)&local_40);
  Pl_ASCII85Decoder::Pl_ASCII85Decoder(&local_90,"decode",&local_40);
  Pl_ASCII85Decoder::write(&local_90,(int)this->data,(void *)this->size,in_RCX);
  Pl_ASCII85Decoder::finish(&local_90);
  Pipeline::~Pipeline(&local_90.super_Pipeline);
  Pl_Discard::~Pl_Discard((Pl_Discard *)&local_40);
  return;
}

Assistant:

void
FuzzHelper::doChecks()
{
    Pl_Discard discard;
    Pl_ASCII85Decoder p("decode", &discard);
    p.write(const_cast<unsigned char*>(data), size);
    p.finish();
}